

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O1

void __thiscall Math_CompensatedSum_Test::~Math_CompensatedSum_Test(Math_CompensatedSum_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Math, CompensatedSum) {
    // In order of decreasing accuracy...
    CompensatedSum<double> kahanSumD;
    long double ldSum = 0;  // note: is plain old double with MSVC
    double doubleSum = 0;
    CompensatedSum<float> kahanSumF;
    float floatSum = 0;

    RNG rng;
    for (int i = 0; i < 16 * 1024 * 1024; ++i) {
        // Hard to sum accurately since the values span many magnitudes.
        float v = std::exp(Lerp(rng.Uniform<Float>(), -5, 20));
        ldSum += v;
        kahanSumD += v;
        doubleSum += v;
        kahanSumF += v;
        floatSum += v;
    }

    int64_t kahanDBits = FloatToBits(double(kahanSumD));
    int64_t ldBits = FloatToBits(double(ldSum));
    int64_t doubleBits = FloatToBits(doubleSum);
    int64_t kahanFBits = FloatToBits(double(float(kahanSumF)));
    int64_t floatBits = FloatToBits(double(floatSum));

    int64_t ldErrorUlps = std::abs(ldBits - kahanDBits);
    int64_t doubleErrorUlps = std::abs(doubleBits - kahanDBits);
    int64_t kahanFErrorUlps = std::abs(kahanFBits - kahanDBits);
    int64_t floatErrorUlps = std::abs(floatBits - kahanDBits);

    // Expect each to be much more accurate than the one before it.
    if (sizeof(long double) > sizeof(double))
        EXPECT_LT(ldErrorUlps * 10000, doubleErrorUlps);
    // Less slop between double and Kahan with floats.
    EXPECT_LT(doubleErrorUlps * 1000, kahanFErrorUlps);
    EXPECT_LT(kahanFErrorUlps * 10000, floatErrorUlps);
}